

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_disk_io.cpp
# Opt level: O3

storage_holder __thiscall
libtorrent::posix_disk_io::new_torrent
          (posix_disk_io *this,storage_params *params,shared_ptr<void> *param_2)

{
  vector<download_priority_t,_file_index_t> *pvVar1;
  posix_storage *this_00;
  undefined8 extraout_RDX;
  pointer __p;
  uint uVar2;
  storage_holder sVar3;
  __single_object storage;
  _Head_base<0UL,_libtorrent::aux::posix_storage_*,_false> local_30;
  
  uVar2 = (uint)((ulong)((long)params->path - (long)params->mapped_files) >> 3);
  ::std::
  vector<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>_>_>
  ::reserve((vector<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>_>_>
             *)&params->priorities,(ulong)(uVar2 + 1));
  pvVar1 = *(vector<download_priority_t,_file_index_t> **)(params->info_hash).m_number._M_elems;
  if (params->priorities != pvVar1) {
    uVar2 = *(uint *)((long)&pvVar1[-1].
                             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             .
                             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    *(undefined1 **)(params->info_hash).m_number._M_elems =
         (undefined1 *)
         ((long)&pvVar1[-1].
                 super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 .
                 super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  }
  this_00 = (posix_storage *)operator_new(0xf0);
  aux::posix_storage::posix_storage(this_00,(storage_params *)param_2);
  if (uVar2 == (uint)((ulong)((long)params->path - (long)params->mapped_files) >> 3)) {
    local_30._M_head_impl = this_00;
    ::std::
    vector<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>,std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>>>
    ::
    emplace_back<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>>
              ((vector<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>,std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>>>
                *)&params->mapped_files,
               (unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
                *)&local_30);
  }
  else {
    local_30._M_head_impl = (posix_storage *)0x0;
    ::std::
    __uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
    ::reset((__uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
             *)(&params->mapped_files->m_piece_length + (ulong)uVar2 * 2),this_00);
  }
  (this->super_disk_interface)._vptr_disk_interface = (_func_int **)params;
  *(uint *)&(this->m_torrents).
            super_vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
            .
            super__Vector_base<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = uVar2;
  ::std::
  unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>::
  ~unique_ptr((unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
               *)&local_30);
  sVar3._8_8_ = extraout_RDX;
  sVar3.m_disk_io = &this->super_disk_interface;
  return sVar3;
}

Assistant:

storage_holder new_torrent(storage_params const& params
			, std::shared_ptr<void> const&) override
		{
			// make sure we can remove this torrent without causing a memory
			// allocation, by causing the allocation now instead
			storage_index_t const idx = m_free_slots.new_index(m_torrents.end_index());
			auto storage = std::make_unique<posix_storage>(params);
			if (idx == m_torrents.end_index()) m_torrents.emplace_back(std::move(storage));
			else m_torrents[idx] = std::move(storage);
			return storage_holder(idx, *this);
		}